

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O1

void Am_Register_Slot_Key(Am_Slot_Key key,char *string)

{
  Am_Symbol_Table *pAVar1;
  const_iterator cVar2;
  char *pcVar3;
  uint *puVar4;
  mapped_type *ppcVar5;
  ostream *poVar6;
  _Base_ptr *pp_Var7;
  char *local_28;
  
  if (Am_Slot_Name_Key_Table == (Am_Symbol_Table *)0x0) {
    Am_Slot_Name_Key_Table = Am_Symbol_Table::Create(500);
  }
  pAVar1 = Am_Slot_Name_Key_Table;
  local_28 = string;
  cVar2 = std::
          _Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
          ::find((_Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                  *)Am_Slot_Name_Key_Table,&local_28);
  pp_Var7 = (_Base_ptr *)&(pAVar1->Am_Map_CStr2Int).mDefaultReturn;
  if ((_Rb_tree_header *)cVar2._M_node !=
      &(pAVar1->Am_Map_CStr2Int).mMap._M_t._M_impl.super__Rb_tree_header) {
    pp_Var7 = &cVar2._M_node[1]._M_parent;
  }
  if (*(int *)pp_Var7 == -1) {
    local_28 = (char *)CONCAT44(local_28._4_4_,(uint)key);
    pcVar3 = OpenAmulet::Map<int,_const_char_*,_std::less<int>_>::GetAt
                       (&Am_Slot_Name_Key_Table->Am_Map_CInt2Str,(int *)&local_28);
    pAVar1 = Am_Slot_Name_Key_Table;
    if (pcVar3 == (char *)0x0) {
      local_28 = string;
      puVar4 = (uint *)std::
                       map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                       ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                                     *)Am_Slot_Name_Key_Table,&local_28);
      *puVar4 = (uint)key;
      local_28 = (char *)CONCAT44(local_28._4_4_,(uint)key);
      ppcVar5 = std::
                map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
      *ppcVar5 = string;
      return;
    }
    std::operator<<((ostream *)&std::cerr,"Slot Key, ");
    Am_Print_Key((ostream *)&std::cerr,key);
    pcVar3 = ", has already been used.";
    poVar6 = (ostream *)&std::cerr;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Slot Name, ");
    poVar6 = std::operator<<(poVar6,string);
    pcVar3 = ", has been overwritten.";
  }
  poVar6 = std::operator<<(poVar6,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar6);
  Am_Error();
}

Assistant:

void
Am_Register_Slot_Key(Am_Slot_Key key, const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key != -1) {
    std::cerr << "Slot Name, " << string << ", has been overwritten."
              << std::endl;
    Am_Error();
  }
  const char *prev_name = Am_Slot_Name_Key_Table->Get_Key(key);
  if (prev_name) {
    std::cerr << "Slot Key, ";
    Am_Print_Key(std::cerr, key);
    std::cerr << ", has already been used." << std::endl;
    Am_Error();
  }
  Am_Slot_Name_Key_Table->Add_Item(key, string);
}